

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O0

int mahjong::thirteen_orphans_shanten
              (tile_t *standing_tiles,intptr_t standing_cnt,useful_table_t *useful_table)

{
  ushort uVar1;
  bool bVar2;
  uchar *__first;
  uchar *__last;
  int local_f0;
  int n_1;
  tile_t t;
  int i_1;
  int ret;
  int n;
  int i;
  int cnt;
  bool has_pair;
  tile_table_t cnt_table;
  useful_table_t *useful_table_local;
  intptr_t standing_cnt_local;
  tile_t *standing_tiles_local;
  
  cnt_table._136_8_ = useful_table;
  if ((standing_tiles == (tile_t *)0x0) || (standing_cnt != 0xd)) {
    standing_tiles_local._4_4_ = std::numeric_limits<int>::max();
  }
  else {
    map_tiles(standing_tiles,0xd,(tile_table_t *)&cnt);
    bVar2 = false;
    n = 0;
    for (ret = 0; ret < 0xd; ret = ret + 1) {
      uVar1 = *(ushort *)((long)&cnt + (ulong)(byte)standard_thirteen_orphans[ret] * 2);
      if ((uVar1 != 0) && (n = n + 1, 1 < uVar1)) {
        bVar2 = true;
      }
    }
    if (bVar2) {
      local_f0 = 0xc - n;
    }
    else {
      local_f0 = 0xd - n;
    }
    if (cnt_table._136_8_ != 0) {
      memset((void *)cnt_table._136_8_,0,0x48);
      __first = std::begin<unsigned_char_const,13ul>((uchar (*) [13])standard_thirteen_orphans);
      __last = std::end<unsigned_char_const,13ul>((uchar (*) [13])standard_thirteen_orphans);
      std::
      for_each<unsigned_char_const*,mahjong::thirteen_orphans_shanten(unsigned_char_const*,long,bool(*)[72])::__0>
                (__first,__last,(anon_class_8_1_6f6e3ae3)cnt_table._136_8_);
      if (bVar2) {
        for (n_1 = 0; n_1 < 0xd; n_1 = n_1 + 1) {
          if (*(short *)((long)&cnt + (ulong)(byte)standard_thirteen_orphans[n_1] * 2) != 0) {
            *(undefined1 *)(cnt_table._136_8_ + (ulong)(byte)standard_thirteen_orphans[n_1]) = 0;
          }
        }
      }
    }
    standing_tiles_local._4_4_ = local_f0;
  }
  return standing_tiles_local._4_4_;
}

Assistant:

int thirteen_orphans_shanten(const tile_t *standing_tiles, intptr_t standing_cnt, useful_table_t *useful_table) {
    if (standing_tiles == nullptr || standing_cnt != 13) {
        return std::numeric_limits<int>::max();
    }

    // 对牌的种类进行打表
    tile_table_t cnt_table;
    map_tiles(standing_tiles, standing_cnt, &cnt_table);

    bool has_pair = false;
    int cnt = 0;
    for (int i = 0; i < 13; ++i) {
        int n = cnt_table[standard_thirteen_orphans[i]];
        if (n > 0) {
            ++cnt;  // 幺九牌的种类
            if (n > 1) {
                has_pair = true;  // 幺九牌对子
            }
        }
    }

    // 当有对子时，上听数为：12-幺九牌的种类
    // 当没有对子时，上听数为：13-幺九牌的种类
    int ret = has_pair ? 12 - cnt : 13 - cnt;

    if (useful_table != nullptr) {
        // 先标记所有的幺九牌为有效牌
        memset(*useful_table, 0, sizeof(*useful_table));
        std::for_each(std::begin(standard_thirteen_orphans), std::end(standard_thirteen_orphans),
            [useful_table](tile_t t) {
            (*useful_table)[t] = true;
        });

        // 当有对子时，已有的幺九牌都不需要了
        if (has_pair) {
            for (int i = 0; i < 13; ++i) {
                tile_t t = standard_thirteen_orphans[i];
                int n = cnt_table[t];
                if (n > 0) {
                    (*useful_table)[t] = false;
                }
            }
        }
    }

    return ret;
}